

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t icu_63::TimeZoneFormat::parseAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,UChar sep,OffsetFields minFields,
                  OffsetFields maxFields)

{
  short sVar1;
  int iVar2;
  char16_t cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int offset;
  int32_t iVar7;
  int32_t fieldLen [3];
  int32_t fieldVal [3];
  
  iVar2 = pos->index;
  fieldVal[2] = 0;
  fieldVal[0] = 0;
  fieldVal[1] = 0;
  fieldLen[2] = -1;
  fieldLen[0] = 0;
  fieldLen[1] = -1;
  iVar7 = 0;
  iVar6 = -1;
  offset = iVar2;
  while( true ) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if ((iVar4 <= offset) || ((int)maxFields < iVar7)) break;
    cVar3 = UnicodeString::doCharAt(text,offset);
    if (cVar3 != sep) {
      iVar4 = fieldLen[iVar7];
      if (iVar4 != -1) {
        iVar5 = (ushort)cVar3 - 0x30;
        if (9 < (ushort)((ushort)cVar3 - 0x30)) {
          iVar5 = -1;
        }
        if (-1 < iVar5) {
          fieldVal[iVar7] = fieldVal[iVar7] * 10 + iVar5;
          fieldLen[iVar7] = iVar4 + 1;
          iVar7 = iVar7 + (uint)(0 < iVar4);
          goto LAB_001fe0ec;
        }
      }
      break;
    }
    if (iVar7 == 0) {
      iVar7 = 0;
      if (fieldLen[0] == 0) {
        fieldLen[0] = 0;
        iVar6 = -1;
LAB_001fe19a:
        if (iVar6 < (int)minFields) {
          pos->errorIndex = iVar2;
          iVar7 = 0;
        }
        else {
          pos->index = fieldLen[0] + iVar2;
        }
        return iVar7;
      }
    }
    else {
      if (fieldLen[iVar7] != -1) break;
      fieldLen[iVar7] = 0;
    }
LAB_001fe0ec:
    offset = offset + 1;
  }
  if (fieldLen[0] == 0) {
    iVar7 = 0;
    fieldLen[0] = 0;
  }
  else if (fieldVal[0] < 0x18) {
    iVar7 = fieldVal[0] * 3600000;
    if (fieldVal[1] < 0x3c && fieldLen[1] == 2) {
      iVar7 = iVar7 + fieldVal[1] * 60000;
      if (fieldVal[2] < 0x3c && fieldLen[2] == 2) {
        iVar7 = iVar7 + fieldVal[2] * 1000;
        fieldLen[0] = fieldLen[0] + 6;
        iVar6 = 2;
      }
      else {
        fieldLen[0] = fieldLen[0] + 3;
        iVar6 = 1;
      }
    }
    else {
      iVar6 = 0;
    }
  }
  else {
    iVar6 = 0;
    iVar7 = (int)((fieldVal._0_8_ & 0xffffffff) / 10) * 3600000;
    fieldLen[0] = 1;
  }
  goto LAB_001fe19a;
}

Assistant:

int32_t
TimeZoneFormat::parseAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, UChar sep, OffsetFields minFields, OffsetFields maxFields) {
    int32_t start = pos.getIndex();
    int32_t fieldVal[] = {0, 0, 0};
    int32_t fieldLen[] = {0, -1, -1};
    for (int32_t idx = start, fieldIdx = 0; idx < text.length() && fieldIdx <= maxFields; idx++) {
        UChar c = text.charAt(idx);
        if (c == sep) {
            if (fieldIdx == 0) {
                if (fieldLen[0] == 0) {
                    // no hours field
                    break;
                }
                // 1 digit hour, move to next field
            } else {
                if (fieldLen[fieldIdx] != -1) {
                    // premature minute or seconds field
                    break;
                }
                fieldLen[fieldIdx] = 0;
            }
            continue;
        } else if (fieldLen[fieldIdx] == -1) {
            // no separator after 2 digit field
            break;
        }
        int32_t digit = DIGIT_VAL(c);
        if (digit < 0) {
            // not a digit
            break;
        }
        fieldVal[fieldIdx] = fieldVal[fieldIdx] * 10 + digit;
        fieldLen[fieldIdx]++;
        if (fieldLen[fieldIdx] >= 2) {
            // parsed 2 digits, move to next field
            fieldIdx++;
        }
    }

    int32_t offset = 0;
    int32_t parsedLen = 0;
    int32_t parsedFields = -1;
    do {
        // hour
        if (fieldLen[0] == 0) {
            break;
        }
        if (fieldVal[0] > MAX_OFFSET_HOUR) {
            offset = (fieldVal[0] / 10) * MILLIS_PER_HOUR;
            parsedFields = FIELDS_H;
            parsedLen = 1;
            break;
        }
        offset = fieldVal[0] * MILLIS_PER_HOUR;
        parsedLen = fieldLen[0];
        parsedFields = FIELDS_H;

        // minute
        if (fieldLen[1] != 2 || fieldVal[1] > MAX_OFFSET_MINUTE) {
            break;
        }
        offset += fieldVal[1] * MILLIS_PER_MINUTE;
        parsedLen += (1 + fieldLen[1]);
        parsedFields = FIELDS_HM;

        // second
        if (fieldLen[2] != 2 || fieldVal[2] > MAX_OFFSET_SECOND) {
            break;
        }
        offset += fieldVal[2] * MILLIS_PER_SECOND;
        parsedLen += (1 + fieldLen[2]);
        parsedFields = FIELDS_HMS;
    } while (false);

    if (parsedFields < minFields) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(start + parsedLen);
    return offset;
}